

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzma_encoder_optimum_normal.c
# Opt level: O1

void lzma_lzma_optimum_normal
               (lzma_lzma1_encoder *coder,lzma_mf *mf,uint32_t *back_res,uint32_t *len_res,
               uint32_t position)

{
  lzma_optimal *plVar1;
  byte bVar2;
  _Bool _Var3;
  byte bVar4;
  byte bVar5;
  short sVar6;
  ushort uVar7;
  ushort uVar8;
  uint8_t *puVar9;
  long lVar10;
  uint uVar11;
  uint32_t uVar12;
  uint32_t uVar13;
  uint32_t uVar14;
  byte *pbVar15;
  undefined4 extraout_var;
  ulong uVar16;
  short *psVar17;
  sbyte sVar18;
  int iVar19;
  uint uVar20;
  uint uVar21;
  byte *pbVar22;
  uint32_t *puVar23;
  lzma_lzma_state lVar24;
  lzma_lzma_state lVar25;
  uint uVar26;
  short *psVar27;
  uint32_t i;
  uint uVar28;
  int iVar29;
  long lVar30;
  uint32_t uVar31;
  uint uVar32;
  uint8_t *puVar33;
  uint uVar34;
  uint uVar35;
  uint32_t (*pauVar36) [128];
  uint uVar37;
  uint uVar38;
  undefined4 in_register_00000084;
  ulong uVar39;
  long lVar40;
  ulong uVar41;
  ulong uVar42;
  uint8_t *puVar43;
  uint32_t (*pauVar44) [64];
  uint uVar45;
  int iVar46;
  uint uVar47;
  uint32_t model_index;
  ulong uVar48;
  lzma_match *matches;
  bool bVar49;
  uint32_t reps [4];
  uint32_t matches_count;
  uint local_138 [3];
  uint32_t uStack_12c;
  uint *local_128;
  uint32_t *local_120;
  long local_118;
  ulong local_110;
  uint8_t *local_108;
  uint32_t local_fc;
  uint32_t (*local_f8) [272];
  uint32_t *local_f0;
  uint local_e8;
  uint local_e4;
  probability (*local_e0) [16];
  lzma_match *local_d8;
  uint32_t (*local_d0) [272];
  long local_c8;
  ulong local_c0;
  ulong local_b8;
  uint32_t *local_b0;
  probability (*local_a8) [16];
  uint local_a0;
  uint local_9c;
  undefined8 local_98;
  undefined8 local_90;
  uint8_t *local_88;
  ulong local_80;
  uint32_t *local_78;
  uint32_t *local_70;
  ushort *local_68;
  uint32_t (*local_60) [128];
  uint32_t (*local_58) [64];
  long local_50;
  ulong local_48;
  uint32_t (*local_40) [272];
  long local_38;
  
  local_98 = CONCAT44(in_register_00000084,position);
  uVar28 = coder->opts_current_index;
  uVar12 = mf->read_ahead;
  local_128 = len_res;
  local_120 = back_res;
  if (coder->opts_end_index == uVar28) {
    if (uVar12 == 0) {
      if (0x7f < coder->match_price_count) {
        pauVar36 = coder->dist_prices;
        puVar23 = coder->dist_slot_prices[0] + 0xe;
        lVar40 = 0;
        pauVar44 = coder->dist_slot_prices;
        do {
          if (coder->dist_table_size != 0) {
            uVar48 = 0;
            do {
              uVar31 = 0;
              uVar28 = (int)uVar48 + 0x40;
              do {
                uVar45 = uVar28 >> 1;
                uVar31 = uVar31 + lzma_rc_prices
                                  [(-(uVar28 & 1) & 0x7f0 ^
                                   (uint)*(ushort *)
                                          ((long)coder->dist_slot[lVar40] +
                                          (ulong)(uVar28 & 0xfffffffe))) >> 4];
                uVar28 = uVar45;
              } while (uVar45 != 1);
              coder->dist_slot_prices[lVar40][uVar48] = uVar31;
              uVar48 = uVar48 + 1;
            } while (uVar48 < coder->dist_table_size);
          }
          if (0xe < coder->dist_table_size) {
            uVar28 = 0x70;
            lVar30 = 0;
            do {
              puVar23[lVar30] = ((uVar28 & 0xfffffff0) + puVar23[lVar30]) - 0x50;
              uVar48 = lVar30 + 0xf;
              uVar28 = uVar28 + 8;
              lVar30 = lVar30 + 1;
            } while (uVar48 < coder->dist_table_size);
          }
          lVar30 = 0;
          do {
            (*pauVar36)[lVar30] = (*pauVar44)[lVar30];
            lVar30 = lVar30 + 1;
          } while (lVar30 != 4);
          lVar40 = lVar40 + 1;
          puVar23 = puVar23 + 0x40;
          pauVar36 = pauVar36 + 1;
          pauVar44 = pauVar44 + 1;
        } while (lVar40 != 4);
        puVar23 = coder->dist_prices[0] + 4;
        lVar40 = 4;
        do {
          bVar2 = ""[lVar40];
          iVar19 = (bVar2 >> 1) - 1;
          uVar45 = (bVar2 & 1 | 2) << ((byte)iVar19 & 0x1f);
          uVar32 = (int)lVar40 - uVar45;
          uVar28 = 1;
          iVar29 = 0;
          do {
            uVar11 = uVar32 & 1;
            uVar48 = (ulong)uVar28;
            uVar28 = uVar11 + uVar28 * 2;
            uVar32 = uVar32 >> 1;
            iVar29 = iVar29 + (uint)lzma_rc_prices
                                    [(-uVar11 & 0x7f0 ^
                                     (uint)*(ushort *)
                                            ((long)coder +
                                            uVar48 * 2 +
                                            ((ulong)uVar45 * 2 - (ulong)((uint)bVar2 + (uint)bVar2))
                                            + 0x70fa)) >> 4];
            iVar19 = iVar19 + -1;
          } while (iVar19 != 0);
          lVar30 = 0;
          do {
            *(int *)((long)puVar23 + lVar30 * 2) =
                 *(int *)((long)coder->dist_slot_prices[0] + lVar30 + (ulong)bVar2 * 4) + iVar29;
            lVar30 = lVar30 + 0x100;
          } while (lVar30 != 0x400);
          lVar40 = lVar40 + 1;
          puVar23 = puVar23 + 1;
        } while (lVar40 != 0x80);
        coder->match_price_count = 0;
      }
      if (0xf < coder->align_price_count) {
        uVar48 = 0;
        do {
          uVar28 = 1;
          iVar19 = -4;
          uVar16 = uVar48 & 0xffffffff;
          uVar31 = 0;
          do {
            uVar45 = (uint)uVar16 & 1;
            uVar39 = (ulong)uVar28;
            uVar28 = uVar45 + uVar28 * 2;
            uVar16 = uVar16 >> 1;
            uVar31 = uVar31 + lzma_rc_prices
                              [(-uVar45 & 0x7f0 ^ (uint)coder->dist_align[uVar39]) >> 4];
            iVar19 = iVar19 + 1;
          } while (iVar19 != 0);
          coder->align_prices[uVar48] = uVar31;
          uVar48 = uVar48 + 1;
        } while (uVar48 != 0x10);
        coder->align_price_count = 0;
      }
    }
    uVar28 = mf->nice_len;
    if (uVar12 == 1) {
      local_fc = coder->matches_count;
      uVar12 = coder->longest_match_length;
    }
    else {
      if (uVar12 != 0) {
        __assert_fail("mf->read_ahead == 1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmliblzma/liblzma/lzma/lzma_encoder_optimum_normal.c"
                      ,0x11c,
                      "uint32_t helper1(lzma_lzma1_encoder *restrict, lzma_mf *restrict, uint32_t *restrict, uint32_t *restrict, uint32_t)"
                     );
      }
      uVar12 = lzma_mf_find(mf,&local_fc,coder->matches);
    }
    uVar45 = mf->read_pos;
    uVar11 = (mf->write_pos - uVar45) + 1;
    uVar32 = 0x111;
    if (uVar11 < 0x111) {
      uVar32 = uVar11;
    }
    if (uVar11 < 2) {
      *local_120 = 0xffffffff;
      *local_128 = 1;
      uVar28 = 0xffffffff;
    }
    else {
      puVar43 = mf->buffer;
      pbVar22 = puVar43 + ((ulong)uVar45 - 1);
      pbVar15 = puVar43 + ((ulong)uVar45 - 2);
      sVar6 = *(short *)(puVar43 + ((ulong)uVar45 - 1));
      lVar40 = 0;
      uVar45 = 0;
      do {
        uVar48 = (ulong)coder->reps[lVar40];
        lVar30 = -uVar48;
        if (sVar6 == *(short *)(pbVar15 + lVar30)) {
          uVar11 = 2;
          do {
            uVar34 = uVar32;
            if (uVar32 <= uVar11) break;
            uVar39 = (ulong)uVar11;
            lVar10 = *(long *)(pbVar15 + lVar30 + uVar11);
            uVar16 = *(long *)(pbVar22 + uVar39) - lVar10;
            if (uVar16 == 0) {
              uVar11 = uVar11 + 8;
            }
            else {
              uVar48 = 0;
              if (uVar16 != 0) {
                for (; (uVar16 >> uVar48 & 1) == 0; uVar48 = uVar48 + 1) {
                }
              }
              uVar11 = ((uint)(uVar48 >> 3) & 0x1fffffff) + uVar11;
              if (uVar11 < uVar32) {
                uVar34 = uVar11;
              }
              uVar48 = (ulong)uVar34;
            }
            uVar34 = (uint)uVar48;
          } while (*(long *)(pbVar22 + uVar39) == lVar10);
          local_138[lVar40] = uVar34;
          if (local_138[uVar45] < uVar34) {
            uVar45 = (uint)lVar40;
          }
        }
        else {
          local_138[lVar40] = 0;
        }
        lVar40 = lVar40 + 1;
      } while (lVar40 != 4);
      uVar32 = local_138[uVar45];
      if (uVar32 < uVar28) {
        if (uVar12 < uVar28) {
          bVar2 = *pbVar22;
          bVar4 = pbVar22[~(ulong)coder->reps[0]];
          if (((uVar32 < 2) && (uVar12 < 2)) && (bVar2 != bVar4)) {
            *local_120 = 0xffffffff;
            *local_128 = 1;
            uVar28 = 0xffffffff;
          }
          else {
            uVar16 = (ulong)coder->state;
            coder->opts[0].state = coder->state;
            uVar45 = coder->pos_mask & (uint)local_98;
            uVar48 = (ulong)(coder->is_match[uVar16][uVar45] >> 4);
            local_108 = (uint8_t *)CONCAT44(local_108._4_4_,(uint)lzma_rc_prices[uVar48]);
            uVar31 = get_literal_price(coder,(uint)local_98,(uint)*pbVar15,6 < uVar16,(uint)bVar4,
                                       (uint)bVar2);
            coder->opts[1].price = uVar31 + (int)local_108;
            coder->opts[1].back_prev = 0xffffffff;
            coder->opts[1].prev_1_is_literal = false;
            bVar5 = lzma_rc_prices[uVar48 ^ 0x7f];
            puVar43 = (uint8_t *)(ulong)(coder->is_rep[uVar16] >> 4);
            iVar19 = (uint)lzma_rc_prices[(ulong)puVar43 ^ 0x7f] + (uint)bVar5;
            if ((bVar2 == bVar4) &&
               (uVar28 = (uint)lzma_rc_prices[coder->is_rep0_long[uVar16][uVar45] >> 4] +
                         (uint)lzma_rc_prices[coder->is_rep0[uVar16] >> 4] + iVar19,
               uVar28 < uVar31 + (int)local_108)) {
              coder->opts[1].price = uVar28;
              coder->opts[1].back_prev = 0;
              coder->opts[1].prev_1_is_literal = false;
            }
            uVar28 = uVar32;
            if (uVar32 < uVar12) {
              uVar28 = uVar12;
            }
            if (uVar28 < 2) {
              *local_120 = coder->opts[1].back_prev;
              *local_128 = 1;
              uVar28 = 0xffffffff;
            }
            else {
              coder->opts[1].pos_prev = 0;
              lVar40 = 0;
              do {
                coder->opts[0].backs[lVar40] = coder->reps[lVar40];
                lVar40 = lVar40 + 1;
              } while (lVar40 != 4);
              puVar23 = &coder->opts[uVar28].price;
              uVar32 = uVar28;
              do {
                *puVar23 = 0x40000000;
                uVar32 = uVar32 - 1;
                puVar23 = puVar23 + -0xb;
              } while (1 < uVar32);
              lVar40 = 0;
              do {
                uVar32 = local_138[lVar40];
                if (1 < uVar32) {
                  uVar48 = (ulong)(coder->is_rep0[uVar16] >> 4);
                  if (lVar40 == 0) {
                    uVar11 = (uint)lzma_rc_prices[uVar48];
                    bVar2 = lzma_rc_prices[(ulong)(coder->is_rep0_long[uVar16][uVar45] >> 4) ^ 0x7f]
                    ;
LAB_001ab47e:
                    iVar29 = bVar2 + uVar11;
                  }
                  else {
                    uVar39 = (ulong)(coder->is_rep1[uVar16] >> 4);
                    if (lVar40 != 1) {
                      uVar11 = (uint)lzma_rc_prices[uVar39 ^ 0x7f] +
                               (uint)lzma_rc_prices[uVar48 ^ 0x7f];
                      bVar2 = lzma_rc_prices
                              [(2 - (uint32_t)lVar40 & 0x7f0 ^ (uint)coder->is_rep2[uVar16]) >> 4];
                      goto LAB_001ab47e;
                    }
                    iVar29 = (uint)lzma_rc_prices[uVar39] + (uint)lzma_rc_prices[uVar48 ^ 0x7f];
                  }
                  puVar23 = (coder->rep_len_encoder).prices[uVar45] + (uVar32 - 2);
                  do {
                    uVar11 = *puVar23 + iVar29 + iVar19;
                    if (uVar11 < coder->opts[uVar32].price) {
                      coder->opts[uVar32].price = uVar11;
                      coder->opts[uVar32].pos_prev = 0;
                      coder->opts[uVar32].back_prev = (uint32_t)lVar40;
                      coder->opts[uVar32].prev_1_is_literal = false;
                    }
                    uVar32 = uVar32 - 1;
                    puVar23 = puVar23 + -1;
                  } while (1 < uVar32);
                }
                lVar40 = lVar40 + 1;
              } while (lVar40 != 4);
              uVar48 = 2;
              if (1 < local_138[0]) {
                uVar48 = (ulong)(local_138[0] + 1);
              }
              local_108 = puVar43;
              if ((uint)uVar48 <= uVar12) {
                bVar2 = lzma_rc_prices[(long)puVar43];
                uVar16 = 0xffffffff;
                do {
                  uVar16 = (ulong)((int)uVar16 + 1);
                } while (coder->matches[uVar16].len < (uint)uVar48);
                while( true ) {
                  uVar32 = coder->matches[uVar16].dist;
                  uVar11 = (uint)uVar48;
                  uVar34 = 3;
                  if (uVar11 < 6) {
                    uVar34 = uVar11 - 2;
                  }
                  if ((ulong)uVar32 < 0x80) {
                    uVar12 = coder->dist_prices[uVar34][uVar32];
                  }
                  else {
                    sVar18 = 0x1e;
                    if (-1 < (int)uVar32) {
                      sVar18 = 0x12;
                    }
                    iVar19 = 0x3c;
                    if (-1 < (int)uVar32) {
                      iVar19 = 0x24;
                    }
                    if (uVar32 < 0x80000) {
                      sVar18 = 6;
                    }
                    if (uVar32 < 0x80000) {
                      iVar19 = 0xc;
                    }
                    uVar12 = coder->align_prices[uVar32 & 0xf] +
                             coder->dist_slot_prices[uVar34][(uint)""[uVar32 >> sVar18] + iVar19];
                  }
                  uVar34 = uVar12 + (uint)bVar2 + (uint)bVar5 +
                           (coder->match_len_encoder).prices[uVar45][uVar11 - 2];
                  if (uVar34 < coder->opts[uVar48].price) {
                    coder->opts[uVar48].price = uVar34;
                    coder->opts[uVar48].pos_prev = 0;
                    coder->opts[uVar48].back_prev = uVar32 + 4;
                    coder->opts[uVar48].prev_1_is_literal = false;
                  }
                  uVar32 = coder->matches[uVar16].len;
                  uVar34 = (int)uVar16 + 1;
                  if ((uVar11 == uVar32) && (uVar34 == local_fc)) break;
                  uVar39 = (ulong)uVar34;
                  if (uVar11 != uVar32) {
                    uVar39 = uVar16;
                  }
                  uVar48 = (ulong)(uVar11 + 1);
                  uVar16 = uVar39;
                }
              }
            }
          }
        }
        else {
          *local_120 = coder->matches[local_fc - 1].dist + 4;
          *local_128 = uVar12;
          uVar28 = 0xffffffff;
          uVar12 = uVar12 - 1;
          if (uVar12 != 0) {
            (*mf->skip)(mf,uVar12);
            uVar28 = 0xffffffff;
            mf->read_ahead = mf->read_ahead + uVar12;
          }
        }
      }
      else {
        *local_120 = uVar45;
        *local_128 = uVar32;
        uVar28 = 0xffffffff;
        uVar12 = uVar32 - 1;
        if (uVar12 != 0) {
          (*mf->skip)(mf,uVar12);
          uVar28 = 0xffffffff;
          mf->read_ahead = mf->read_ahead + uVar12;
        }
      }
    }
    if (uVar28 == 0xffffffff) {
      return;
    }
    local_138[0] = (uint)*(undefined8 *)coder->reps;
    local_138[1] = (uint)((ulong)*(undefined8 *)coder->reps >> 0x20);
    local_138[2] = (uint)*(undefined8 *)(coder->reps + 2);
    uStack_12c = (uint32_t)((ulong)*(undefined8 *)(coder->reps + 2) >> 0x20);
    puVar43 = (uint8_t *)0x1;
    if (1 < uVar28) {
      local_78 = &coder->matches_count;
      matches = coder->matches;
      local_e0 = coder->is_match;
      local_a8 = coder->is_rep0_long;
      local_d0 = (coder->rep_len_encoder).prices;
      local_40 = (coder->match_len_encoder).prices;
      local_58 = coder->dist_slot_prices;
      local_60 = coder->dist_prices;
      local_b0 = coder->opts[0].backs;
      local_70 = coder->opts[1].backs;
      local_f0 = &coder->opts[1].price;
      local_e8 = 0xffe;
      local_118 = 0;
      puVar43 = (uint8_t *)0x1;
      local_d8 = matches;
      do {
        puVar23 = local_78;
        if (local_118 == 0xfff) {
          __assert_fail("cur < OPTS",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmliblzma/liblzma/lzma/lzma_encoder_optimum_normal.c"
                        ,0x34c,
                        "void lzma_lzma_optimum_normal(lzma_lzma1_encoder *restrict, lzma_mf *restrict, uint32_t *restrict, uint32_t *restrict, uint32_t)"
                       );
        }
        uVar12 = lzma_mf_find(mf,local_78,matches);
        local_90 = CONCAT44(extraout_var,uVar12);
        coder->longest_match_length = uVar12;
        local_b8 = (ulong)mf->nice_len;
        if (mf->nice_len <= uVar12) break;
        uVar45 = mf->read_pos;
        local_a0 = (mf->write_pos - uVar45) + 1;
        uVar12 = (uint32_t)puVar43;
        uVar32 = 0xfff - uVar12;
        if (local_a0 < 0xfff - uVar12) {
          uVar32 = local_a0;
        }
        plVar1 = coder->opts + (long)puVar43;
        uVar11 = coder->opts[(long)puVar43].pos_prev;
        puVar33 = (uint8_t *)(ulong)uVar11;
        _Var3 = coder->opts[(long)puVar43].prev_1_is_literal;
        if (_Var3 == true) {
          uVar11 = uVar11 - 1;
          puVar33 = (uint8_t *)(ulong)uVar11;
          if (plVar1->prev_2 == true) {
            lVar25 = coder->opts[plVar1->pos_prev_2].state;
            if (plVar1->back_prev_2 < 4) {
              lVar24 = (uint)(STATE_SHORTREP_LIT < lVar25) * 3 + STATE_LIT_LONGREP;
            }
            else {
              lVar24 = (uint)(STATE_SHORTREP_LIT < lVar25) * 3 + STATE_LIT_MATCH;
            }
          }
          else {
            lVar24 = coder->opts[uVar11].state;
          }
          lVar25 = (lVar24 - STATE_SHORTREP_LIT) + (uint)(lVar24 < STATE_NONLIT_MATCH) * 3;
          if (lVar24 < STATE_MATCH_LIT) {
            lVar25 = STATE_LIT_LIT;
          }
        }
        else {
          lVar25 = coder->opts[(long)puVar33].state;
        }
        puVar9 = mf->buffer;
        local_e4 = *puVar23;
        uVar48 = (ulong)local_e4;
        if (puVar43 + -1 == puVar33) {
          if (plVar1->back_prev == 0) {
            lVar24 = (uint)(STATE_SHORTREP_LIT < lVar25) * 2 + STATE_LIT_SHORTREP;
          }
          else {
            lVar24 = (lVar25 - STATE_SHORTREP_LIT) + (uint)(lVar25 < STATE_NONLIT_MATCH) * 3;
            if (lVar25 < STATE_MATCH_LIT) {
              lVar24 = STATE_LIT_LIT;
            }
          }
        }
        else {
          if ((_Var3 == false) || (plVar1->prev_2 != true)) {
            uVar11 = plVar1->back_prev;
            if (uVar11 < 4) goto LAB_001ab89c;
            lVar24 = (uint)(STATE_SHORTREP_LIT < lVar25) * 3 + STATE_LIT_MATCH;
          }
          else {
            puVar33 = (uint8_t *)(ulong)plVar1->pos_prev_2;
            uVar11 = plVar1->back_prev_2;
LAB_001ab89c:
            lVar24 = (uint)(STATE_SHORTREP_LIT < lVar25) * 3 + STATE_LIT_LONGREP;
          }
          if (uVar11 < 4) {
            local_138[0] = coder->opts[(long)puVar33].backs[uVar11];
            if (uVar11 == 0) {
              uVar11 = 1;
            }
            else {
              uVar11 = uVar11 + 1;
              memcpy(local_138 + 1,local_b0 + (long)puVar33 * 0xb,(ulong)uVar11 * 4 - 4);
            }
            puVar23 = local_b0;
            if (uVar11 < 4) {
              uVar16 = (ulong)uVar11;
              do {
                local_138[uVar16] = puVar23[(long)puVar33 * 0xb + uVar16];
                uVar16 = uVar16 + 1;
              } while ((int)uVar16 != 4);
            }
          }
          else {
            local_138[0] = uVar11 - 4;
            uStack_12c = local_b0[(long)puVar33 * 0xb + 2];
            local_138[1] = (uint)*(undefined8 *)(local_b0 + (long)puVar33 * 0xb);
            local_138[2] = (uint)((ulong)*(undefined8 *)(local_b0 + (long)puVar33 * 0xb) >> 0x20);
          }
        }
        puVar23 = local_70 + local_118 * 0xb;
        local_108 = (uint8_t *)((long)*(uint32_t (*) [272])(ulong)uVar45 + (long)puVar9);
        uVar34 = uVar12 + (int)local_98;
        local_c0 = (ulong)uVar34;
        plVar1->state = lVar24;
        *puVar23 = local_138[0];
        *(ulong *)(puVar23 + 1) = CONCAT44(local_138[2],local_138[1]);
        puVar23[3] = uStack_12c;
        uVar31 = plVar1->price;
        bVar2 = local_108[-1];
        uVar42 = (ulong)local_138[0];
        bVar4 = local_108[-2 - uVar42];
        uVar11 = coder->pos_mask;
        uVar39 = (ulong)(uVar11 & uVar34);
        uVar16 = (ulong)lVar24;
        local_110 = uVar16 * 0x20;
        uVar41 = (ulong)(local_e0[uVar16][uVar39] >> 4);
        bVar5 = lzma_rc_prices[uVar41];
        puVar33 = (uint8_t *)(ulong)bVar5;
        local_f8 = (uint32_t (*) [272])(ulong)uVar45;
        uVar13 = get_literal_price(coder,uVar34,(uint)local_108[-2],STATE_SHORTREP_LIT < lVar24,
                                   (uint)bVar4,(uint)bVar2);
        uVar45 = uVar13 + uVar31 + (uint)bVar5;
        local_88 = puVar43 + 1;
        bVar49 = uVar45 < coder->opts[(long)(puVar43 + 1)].price;
        if (bVar49) {
          coder->opts[(long)(puVar43 + 1)].price = uVar45;
          coder->opts[(long)(puVar43 + 1)].pos_prev = uVar12;
          coder->opts[(long)(puVar43 + 1)].back_prev = 0xffffffff;
          coder->opts[(long)(puVar43 + 1)].prev_1_is_literal = false;
        }
        iVar29 = uVar31 + lzma_rc_prices[uVar41 ^ 0x7f];
        uVar41 = (ulong)(coder->is_rep[uVar16] >> 4);
        iVar19 = (uint)lzma_rc_prices[uVar41 ^ 0x7f] + iVar29;
        local_c8 = CONCAT44(local_c8._4_4_,iVar19);
        if ((bVar4 == bVar2) &&
           ((puVar43 <= (uint8_t *)(ulong)coder->opts[(long)(puVar43 + 1)].pos_prev ||
            (coder->opts[(long)(puVar43 + 1)].back_prev != 0)))) {
          puVar33 = (uint8_t *)(CONCAT71((int7)(uVar48 >> 8),bVar2) & 0xffffffff);
          uVar34 = (uint)lzma_rc_prices[*(ushort *)((long)*local_a8 + uVar39 * 2 + local_110) >> 4]
                   + (uint)lzma_rc_prices[coder->is_rep0[uVar16] >> 4] + iVar19;
          if (uVar34 <= coder->opts[(long)(puVar43 + 1)].price) {
            coder->opts[(long)(puVar43 + 1)].price = uVar34;
            coder->opts[(long)(puVar43 + 1)].pos_prev = uVar12;
            coder->opts[(long)(puVar43 + 1)].back_prev = 0;
            coder->opts[(long)(puVar43 + 1)].prev_1_is_literal = false;
            bVar49 = true;
          }
        }
        matches = local_d8;
        if (1 < uVar32) {
          psVar27 = (short *)(puVar9 + (long)(local_f8 + -1) + 0x43f);
          uVar20 = (uint)local_b8;
          uVar34 = uVar20;
          if (uVar32 < uVar20) {
            uVar34 = uVar32;
          }
          local_80 = uVar41;
          if (bVar4 != bVar2 && !bVar49) {
            uVar38 = uVar20 + 1;
            if (uVar32 <= uVar20 + 1) {
              uVar38 = uVar32;
            }
            if (uVar20 == 0xffffffff) {
LAB_001ac727:
              __assert_fail("len <= limit",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmliblzma/liblzma/common/memcmplen.h"
                            ,0x2e,
                            "uint32_t lzma_memcmplen(const uint8_t *, const uint8_t *, uint32_t, uint32_t)"
                           );
            }
            uVar20 = 1;
            uVar48 = local_b8;
            do {
              uVar26 = uVar38;
              if (uVar38 <= uVar20) break;
              lVar40 = *(long *)((long)psVar27 + (ulong)uVar20);
              lVar30 = *(long *)((long)psVar27 + (ulong)uVar20 + ~uVar42);
              uVar41 = lVar40 - lVar30;
              if (uVar41 == 0) {
                uVar20 = uVar20 + 8;
              }
              else {
                uVar48 = 0;
                if (uVar41 != 0) {
                  for (; (uVar41 >> uVar48 & 1) == 0; uVar48 = uVar48 + 1) {
                  }
                }
                uVar20 = ((uint)(uVar48 >> 3) & 0x1fffffff) + uVar20;
                if (uVar20 < uVar38) {
                  uVar26 = uVar20;
                }
                uVar48 = (ulong)uVar26;
              }
              uVar26 = (uint)uVar48;
            } while (lVar40 == lVar30);
            if (uVar26 - 3 < 0xfffffffe) {
              uVar20 = (lVar24 - STATE_SHORTREP_LIT) + (uint)(lVar24 < STATE_NONLIT_MATCH) * 3;
              if (lVar24 < STATE_MATCH_LIT) {
                uVar20 = 0;
              }
              uVar21 = (int)local_c0 + 1U & uVar11;
              uVar7 = local_e0[uVar20][uVar21];
              uVar8 = coder->is_rep[uVar20];
              uVar38 = uVar26 + uVar12;
              if (uVar28 < uVar38) {
                puVar23 = local_f0 + (ulong)uVar28 * 0xb;
                lVar40 = 0;
                do {
                  *puVar23 = 0x40000000;
                  lVar40 = lVar40 + -1;
                  puVar23 = puVar23 + 0xb;
                } while ((ulong)uVar28 - (ulong)(uVar26 + uVar12) != lVar40);
                uVar28 = uVar28 - (int)lVar40;
              }
              uVar45 = uVar45 + lzma_rc_prices[(ulong)(uVar7 >> 4) ^ 0x7f] +
                       (uint)lzma_rc_prices[(ulong)(uVar8 >> 4) ^ 0x7f] +
                       local_d0[uVar21][uVar26 - 3] +
                       (uint)lzma_rc_prices[coder->is_rep0[uVar20] >> 4] +
                       (uint)lzma_rc_prices[(ulong)(local_a8[uVar20][uVar21] >> 4) ^ 0x7f];
              puVar33 = puVar43;
              if (uVar45 < coder->opts[uVar38].price) {
                coder->opts[uVar38].price = uVar45;
                coder->opts[uVar38].pos_prev = (uint32_t)local_88;
                coder->opts[uVar38].back_prev = 0;
                coder->opts[uVar38].prev_1_is_literal = true;
                coder->opts[uVar38].prev_2 = false;
              }
            }
          }
          local_108 = local_108 + -2;
          local_68 = (ushort *)((long)*local_a8 + uVar39 * 2 + local_110);
          local_38 = uVar39 * 0x440;
          local_f8 = local_d0 + uVar39;
          uVar45 = 2;
          local_50 = (long)*local_e0 + (ulong)(((uint)(STATE_SHORTREP_LIT < lVar24) * 3 + 8) * 0x20)
          ;
          lVar40 = 0;
          do {
            psVar17 = (short *)(local_108 + -(ulong)local_138[lVar40]);
            if (*psVar27 == *psVar17) {
              if (uVar34 < 2) goto LAB_001ac727;
              uVar20 = 2;
              do {
                if (uVar34 <= uVar20) {
                  puVar33 = (uint8_t *)(ulong)uVar34;
                  break;
                }
                lVar30 = *(long *)((long)psVar27 + (ulong)uVar20);
                lVar10 = *(long *)((long)psVar17 + (ulong)uVar20);
                uVar48 = lVar30 - lVar10;
                if (uVar48 == 0) {
                  uVar20 = uVar20 + 8;
                }
                else {
                  uVar39 = 0;
                  if (uVar48 != 0) {
                    for (; (uVar48 >> uVar39 & 1) == 0; uVar39 = uVar39 + 1) {
                    }
                  }
                  uVar20 = ((uint)(uVar39 >> 3) & 0x1fffffff) + uVar20;
                  uVar38 = uVar34;
                  if (uVar20 < uVar34) {
                    uVar38 = uVar20;
                  }
                  puVar33 = (uint8_t *)(ulong)uVar38;
                }
              } while (lVar30 == lVar10);
              iVar19 = (int)puVar33;
              local_110 = (ulong)(uVar12 + iVar19);
              if (uVar28 < uVar12 + iVar19) {
                puVar23 = local_f0 + (ulong)uVar28 * 0xb;
                lVar30 = 0;
                do {
                  *puVar23 = 0x40000000;
                  lVar30 = lVar30 + -1;
                  puVar23 = puVar23 + 0xb;
                } while ((ulong)uVar28 - (ulong)(uVar12 + iVar19) != lVar30);
                uVar28 = uVar28 - (int)lVar30;
              }
              uVar7 = coder->is_rep0[uVar16] >> 4;
              uVar31 = (uint32_t)lVar40;
              if (lVar40 == 0) {
                bVar2 = lzma_rc_prices[uVar7];
                uVar48 = (ulong)(*local_68 >> 4) ^ 0x7f;
LAB_001abf22:
                iVar46 = (uint)lzma_rc_prices[uVar48] + (uint)bVar2;
              }
              else {
                bVar2 = lzma_rc_prices[(ulong)uVar7 ^ 0x7f];
                uVar7 = coder->is_rep1[uVar16] >> 4;
                uVar48 = (ulong)uVar7;
                if (lVar40 == 1) goto LAB_001abf22;
                iVar46 = (uint)lzma_rc_prices
                               [(2 - uVar31 & 0x7f0 ^ (uint)coder->is_rep2[uVar16]) >> 4] +
                         (uint)lzma_rc_prices[(ulong)uVar7 ^ 0x7f] + (uint)bVar2;
              }
              iVar46 = iVar46 + (int)local_c8;
              puVar23 = *local_f8 + (iVar19 - 2U);
              uVar48 = (ulong)puVar33 & 0xffffffff;
              do {
                uVar20 = *puVar23 + iVar46;
                uVar38 = uVar12 + (int)uVar48;
                if (uVar20 < coder->opts[uVar38].price) {
                  coder->opts[uVar38].price = uVar20;
                  coder->opts[uVar38].pos_prev = uVar12;
                  coder->opts[uVar38].back_prev = uVar31;
                  coder->opts[uVar38].prev_1_is_literal = false;
                }
                uVar20 = (int)uVar48 - 1;
                uVar48 = (ulong)uVar20;
                puVar23 = puVar23 + -1;
              } while (1 < uVar20);
              uVar20 = iVar19 + 1;
              if (lVar40 == 0) {
                uVar45 = uVar20;
              }
              uVar38 = (int)local_b8 + iVar19 + 1;
              if (uVar32 <= uVar38) {
                uVar38 = uVar32;
              }
              uVar26 = uVar20;
              uVar21 = uVar20;
              uVar37 = uVar20;
              if (uVar20 < uVar38) {
                do {
                  uVar26 = uVar38;
                  if (uVar38 <= uVar37) break;
                  lVar30 = *(long *)((long)psVar27 + (ulong)uVar37);
                  lVar10 = *(long *)((long)psVar17 + (ulong)uVar37);
                  uVar48 = lVar30 - lVar10;
                  if (uVar48 == 0) {
                    uVar37 = uVar37 + 8;
                    uVar26 = uVar21;
                  }
                  else {
                    uVar39 = 0;
                    if (uVar48 != 0) {
                      for (; (uVar48 >> uVar39 & 1) == 0; uVar39 = uVar39 + 1) {
                      }
                    }
                    uVar37 = ((uint)(uVar39 >> 3) & 0x1fffffff) + uVar37;
                    if (uVar37 < uVar38) {
                      uVar26 = uVar37;
                    }
                  }
                  uVar21 = uVar26;
                } while (lVar30 == lVar10);
              }
              if (1 < uVar26 - uVar20) {
                uVar38 = (int)local_c0 + iVar19;
                uVar13 = (*local_f8)[iVar19 - 2U];
                local_9c = (uint)lzma_rc_prices
                                 [*(ushort *)(local_50 + (ulong)(uVar38 & uVar11) * 2) >> 4];
                local_48 = (ulong)(uVar26 - uVar20);
                uVar14 = get_literal_price(coder,uVar38,
                                           (uint)*(byte *)((long)psVar27 + (ulong)(iVar19 - 1)),true
                                           ,(uint)*(byte *)((long)psVar17 +
                                                           ((ulong)puVar33 & 0xffffffff)),
                                           (uint)*(byte *)((long)psVar27 +
                                                          ((ulong)puVar33 & 0xffffffff)));
                uVar38 = (int)local_c0 + iVar19 + 1U & uVar11;
                uVar7 = coder->is_match[5][uVar38];
                uVar8 = coder->is_rep[5];
                uVar20 = (int)local_110 + (int)local_48 + 1;
                if (uVar28 < uVar20) {
                  puVar23 = local_f0 + (ulong)uVar28 * 0xb;
                  lVar30 = 0;
                  do {
                    *puVar23 = 0x40000000;
                    lVar30 = lVar30 + -1;
                    puVar23 = puVar23 + 0xb;
                  } while ((ulong)uVar28 - (ulong)(uVar26 + uVar12) != lVar30);
                  uVar28 = uVar28 - (int)lVar30;
                }
                puVar33 = lzma_rc_prices;
                uVar38 = uVar13 + iVar46 + local_9c + uVar14 +
                         (uint)lzma_rc_prices[(ulong)(uVar7 >> 4) ^ 0x7f] +
                         (uint)lzma_rc_prices[(ulong)(uVar8 >> 4) ^ 0x7f] +
                         local_d0[uVar38][(int)local_48 - 2] +
                         (uint)lzma_rc_prices[coder->is_rep0[5] >> 4] +
                         (uint)lzma_rc_prices[(ulong)(coder->is_rep0_long[5][uVar38] >> 4) ^ 0x7f];
                if (uVar38 < coder->opts[uVar20].price) {
                  coder->opts[uVar20].price = uVar38;
                  coder->opts[uVar20].pos_prev = (int)local_110 + 1;
                  coder->opts[uVar20].back_prev = 0;
                  coder->opts[uVar20].prev_1_is_literal = true;
                  coder->opts[uVar20].prev_2 = true;
                  coder->opts[uVar20].pos_prev_2 = uVar12;
                  coder->opts[uVar20].back_prev_2 = uVar31;
                }
              }
            }
            lVar40 = lVar40 + 1;
          } while (lVar40 != 4);
          uVar20 = (uint)local_90;
          uVar38 = uVar20;
          if (uVar34 < uVar20) {
            uVar48 = 0;
            do {
              uVar16 = uVar48;
              local_e4 = (int)uVar16 + 1;
              uVar48 = (ulong)local_e4;
            } while (local_d8[uVar16].len < uVar34);
            local_d8[uVar16].len = uVar34;
            uVar38 = uVar34;
          }
          matches = local_d8;
          if (uVar45 <= uVar38) {
            if (uVar28 < uVar38 + uVar12) {
              if ((uint)local_b8 <= uVar20) {
                uVar20 = (uint)local_b8;
              }
              if (local_e8 <= uVar20) {
                uVar20 = local_e8;
              }
              if (local_a0 <= uVar20) {
                uVar20 = local_a0;
              }
              puVar23 = local_f0 + (ulong)uVar28 * 0xb;
              lVar40 = 0;
              do {
                *puVar23 = 0x40000000;
                lVar40 = lVar40 + -1;
                puVar23 = puVar23 + 0xb;
              } while ((ulong)uVar28 - (ulong)(uVar20 + uVar12) != lVar40);
              uVar28 = uVar28 - (int)lVar40;
            }
            bVar2 = lzma_rc_prices[local_80];
            uVar48 = 0xffffffff;
            do {
              uVar48 = (ulong)((int)uVar48 + 1);
            } while (local_d8[uVar48].len < uVar45);
            local_c8 = (long)*local_e0 +
                       (ulong)(((uint)(STATE_SHORTREP_LIT < lVar24) * 3 + 7) * 0x20);
            do {
              uVar34 = matches[uVar48].dist;
              uVar16 = (ulong)uVar34;
              uVar20 = 3;
              if (uVar45 < 6) {
                uVar20 = uVar45 - 2;
              }
              if (uVar16 < 0x80) {
                uVar31 = local_60[uVar20][uVar16];
              }
              else {
                sVar18 = 0x1e;
                if (-1 < (int)uVar34) {
                  sVar18 = 0x12;
                }
                iVar19 = 0x3c;
                if (-1 < (int)uVar34) {
                  iVar19 = 0x24;
                }
                if (uVar34 < 0x80000) {
                  sVar18 = 6;
                  iVar19 = 0xc;
                }
                uVar31 = coder->align_prices[uVar34 & 0xf] +
                         local_58[uVar20][(uint)""[uVar34 >> sVar18] + iVar19];
              }
              uVar38 = uVar31 + iVar29 + (uint)bVar2 +
                       *(int *)((long)*local_40 + (ulong)(uVar45 - 2) * 4 + local_38);
              uVar20 = uVar45 + uVar12;
              if (uVar38 < coder->opts[uVar20].price) {
                coder->opts[uVar20].price = uVar38;
                coder->opts[uVar20].pos_prev = uVar12;
                coder->opts[uVar20].back_prev = uVar34 + 4;
                coder->opts[uVar20].prev_1_is_literal = false;
              }
              bVar49 = true;
              if (uVar45 == matches[uVar48].len) {
                uVar21 = uVar45 + 1;
                uVar26 = (int)local_b8 + uVar45 + 1;
                if (uVar32 <= uVar26) {
                  uVar26 = uVar32;
                }
                uVar37 = uVar21;
                uVar47 = uVar21;
                uVar35 = uVar21;
                if (uVar21 < uVar26) {
                  do {
                    uVar37 = uVar26;
                    if (uVar26 <= uVar35) break;
                    uVar39 = (ulong)uVar35;
                    lVar40 = *(long *)((long)psVar27 + uVar39);
                    uVar42 = lVar40 - *(long *)(local_108 + (uVar39 - uVar16));
                    if (uVar42 == 0) {
                      uVar35 = uVar35 + 8;
                      uVar37 = uVar47;
                    }
                    else {
                      uVar41 = 0;
                      if (uVar42 != 0) {
                        for (; (uVar42 >> uVar41 & 1) == 0; uVar41 = uVar41 + 1) {
                        }
                      }
                      uVar35 = ((uint)(uVar41 >> 3) & 0x1fffffff) + uVar35;
                      if (uVar35 < uVar26) {
                        uVar37 = uVar35;
                      }
                    }
                    uVar47 = uVar37;
                  } while (lVar40 == *(long *)(local_108 + (uVar39 - uVar16)));
                }
                uVar21 = uVar37 - uVar21;
                if (1 < uVar21) {
                  uVar26 = uVar45 + (int)local_c0;
                  uVar47 = uVar26 & uVar11;
                  local_110 = CONCAT44(local_110._4_4_,
                                       (uint)lzma_rc_prices
                                             [*(ushort *)(local_c8 + (ulong)uVar47 * 2) >> 4]);
                  uVar31 = get_literal_price(coder,uVar26,
                                             (uint)*(byte *)((long)psVar27 + (ulong)(uVar45 - 1)),
                                             true,(uint)local_108[uVar45 - uVar16],
                                             (uint)*(byte *)((long)psVar27 + (ulong)uVar45));
                  local_f8 = (uint32_t (*) [272])CONCAT44(local_f8._4_4_,uVar31);
                  uVar47 = uVar47 + 1 & uVar11;
                  uVar7 = coder->is_match[4][uVar47];
                  uVar8 = coder->is_rep[4];
                  uVar26 = uVar20 + uVar21 + 1;
                  if (uVar28 < uVar26) {
                    puVar23 = local_f0 + (ulong)uVar28 * 0xb;
                    lVar40 = 0;
                    do {
                      *puVar23 = 0x40000000;
                      lVar40 = lVar40 + -1;
                      puVar23 = puVar23 + 0xb;
                    } while ((ulong)uVar28 - (ulong)(uVar37 + uVar12) != lVar40);
                    uVar28 = uVar28 - (int)lVar40;
                  }
                  uVar38 = uVar38 + (int)local_110 + uVar31 +
                           (uint)lzma_rc_prices[(ulong)(uVar7 >> 4) ^ 0x7f] +
                           (uint)lzma_rc_prices[(ulong)(uVar8 >> 4) ^ 0x7f] +
                           local_d0[uVar47][uVar21 - 2] +
                           (uint)lzma_rc_prices[coder->is_rep0[4] >> 4] +
                           (uint)lzma_rc_prices[(ulong)(coder->is_rep0_long[4][uVar47] >> 4) ^ 0x7f]
                  ;
                  matches = local_d8;
                  if (uVar38 < coder->opts[uVar26].price) {
                    coder->opts[uVar26].price = uVar38;
                    coder->opts[uVar26].pos_prev = uVar20 + 1;
                    coder->opts[uVar26].back_prev = 0;
                    coder->opts[uVar26].prev_1_is_literal = true;
                    coder->opts[uVar26].prev_2 = true;
                    coder->opts[uVar26].pos_prev_2 = uVar12;
                    coder->opts[uVar26].back_prev_2 = uVar34 + 4;
                  }
                }
                uVar34 = (int)uVar48 + 1;
                uVar48 = (ulong)uVar34;
                bVar49 = uVar34 != local_e4;
              }
              uVar45 = uVar45 + 1;
            } while (bVar49);
          }
        }
        local_118 = local_118 + 1;
        local_e8 = local_e8 - 1;
        puVar43 = local_88;
      } while (local_88 < (uint8_t *)(ulong)uVar28);
    }
    coder->opts_end_index = (uint32_t)puVar43;
    uVar28 = coder->opts[(ulong)puVar43 & 0xffffffff].pos_prev;
    uVar12 = coder->opts[(ulong)puVar43 & 0xffffffff].back_prev;
    do {
      puVar33 = (uint8_t *)(ulong)uVar28;
      uVar48 = (ulong)puVar43 & 0xffffffff;
      if (coder->opts[uVar48].prev_1_is_literal == true) {
        coder->opts[(long)puVar33].back_prev = 0xffffffff;
        coder->opts[(long)puVar33].prev_1_is_literal = false;
        uVar45 = uVar28 - 1;
        coder->opts[(long)puVar33].pos_prev = uVar45;
        if (coder->opts[uVar48].prev_2 == true) {
          coder->opts[uVar45].prev_1_is_literal = false;
          coder->opts[uVar45].pos_prev = coder->opts[uVar48].pos_prev_2;
          coder->opts[uVar45].back_prev = coder->opts[uVar48].back_prev_2;
        }
      }
      uVar45 = coder->opts[(long)puVar33].pos_prev;
      uVar31 = coder->opts[(long)puVar33].back_prev;
      coder->opts[(long)puVar33].back_prev = uVar12;
      coder->opts[(long)puVar33].pos_prev = (uint32_t)puVar43;
      bVar49 = uVar28 != 0;
      puVar43 = puVar33;
      uVar28 = uVar45;
      uVar12 = uVar31;
    } while (bVar49);
    uVar28 = coder->opts[0].pos_prev;
    coder->opts_current_index = uVar28;
    *local_128 = uVar28;
    uVar31 = coder->opts[0].back_prev;
  }
  else {
    if (uVar12 == 0) {
      __assert_fail("mf->read_ahead > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmliblzma/liblzma/lzma/lzma_encoder_optimum_normal.c"
                    ,0x32b,
                    "void lzma_lzma_optimum_normal(lzma_lzma1_encoder *restrict, lzma_mf *restrict, uint32_t *restrict, uint32_t *restrict, uint32_t)"
                   );
    }
    uVar12 = coder->opts[uVar28].pos_prev;
    uVar31 = coder->opts[uVar28].back_prev;
    coder->opts_current_index = uVar12;
    *len_res = uVar12 - uVar28;
  }
  *local_120 = uVar31;
  return;
}

Assistant:

extern void
lzma_lzma_optimum_normal(lzma_lzma1_encoder *restrict coder,
		lzma_mf *restrict mf,
		uint32_t *restrict back_res, uint32_t *restrict len_res,
		uint32_t position)
{
	// If we have symbols pending, return the next pending symbol.
	if (coder->opts_end_index != coder->opts_current_index) {
		assert(mf->read_ahead > 0);
		*len_res = coder->opts[coder->opts_current_index].pos_prev
				- coder->opts_current_index;
		*back_res = coder->opts[coder->opts_current_index].back_prev;
		coder->opts_current_index = coder->opts[
				coder->opts_current_index].pos_prev;
		return;
	}

	// Update the price tables. In LZMA SDK <= 4.60 (and possibly later)
	// this was done in both initialization function and in the main loop.
	// In liblzma they were moved into this single place.
	if (mf->read_ahead == 0) {
		if (coder->match_price_count >= (1 << 7))
			fill_dist_prices(coder);

		if (coder->align_price_count >= ALIGN_SIZE)
			fill_align_prices(coder);
	}

	// TODO: This needs quite a bit of cleaning still. But splitting
	// the original function into two pieces makes it at least a little
	// more readable, since those two parts don't share many variables.

	uint32_t len_end = helper1(coder, mf, back_res, len_res, position);
	if (len_end == UINT32_MAX)
		return;

	uint32_t reps[REPS];
	memcpy(reps, coder->reps, sizeof(reps));

	uint32_t cur;
	for (cur = 1; cur < len_end; ++cur) {
		assert(cur < OPTS);

		coder->longest_match_length = mf_find(
				mf, &coder->matches_count, coder->matches);

		if (coder->longest_match_length >= mf->nice_len)
			break;

		len_end = helper2(coder, reps, mf_ptr(mf) - 1, len_end,
				position + cur, cur, mf->nice_len,
				my_min(mf_avail(mf) + 1, OPTS - 1 - cur));
	}

	backward(coder, len_res, back_res, cur);
	return;
}